

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

bool __thiscall cmMakefile::IsLaterStandard(cmMakefile *this,string *lang,string *lhs,string *rhs)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  char **ppcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  bool bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_120;
  size_type local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_100;
  size_type local_f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_e0;
  size_type local_d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c0;
  size_type local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  cmStrCmp local_a0;
  cmStrCmp local_80;
  cmStrCmp local_60;
  cmStrCmp local_40;
  
  iVar3 = std::__cxx11::string::compare((char *)lang);
  if (iVar3 == 0) {
    pcVar2 = (rhs->_M_dataplus)._M_p;
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_100,pcVar2,pcVar2 + rhs->_M_string_length);
    paVar6 = &local_40.m_test.field_2;
    if (local_100 == &local_f0) {
      local_40.m_test.field_2._8_8_ = local_f0._8_8_;
      local_40.m_test._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_40.m_test._M_dataplus._M_p = (pointer)local_100;
    }
    local_40.m_test.field_2._M_allocated_capacity._1_7_ = local_f0._M_allocated_capacity._1_7_;
    local_40.m_test.field_2._M_local_buf[0] = local_f0._M_local_buf[0];
    local_40.m_test._M_string_length = local_f8;
    local_f8 = 0;
    local_f0._M_local_buf[0] = '\0';
    local_100 = &local_f0;
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>(C_STANDARDS,(char **)&DAT_0066d078,&local_40)
    ;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40.m_test._M_dataplus._M_p != paVar6) {
      operator_delete(local_40.m_test._M_dataplus._M_p,
                      local_40.m_test.field_2._M_allocated_capacity + 1);
    }
    if (local_100 != &local_f0) {
      operator_delete(local_100,
                      CONCAT71(local_f0._M_allocated_capacity._1_7_,local_f0._M_local_buf[0]) + 1);
    }
    paVar6 = &local_b0;
    pcVar2 = (lhs->_M_dataplus)._M_p;
    local_c0 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_c0,pcVar2,pcVar2 + lhs->_M_string_length);
    paVar1 = &local_60.m_test.field_2;
    if (local_c0 == paVar6) {
      local_60.m_test.field_2._8_8_ = local_b0._8_8_;
      local_60.m_test._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_60.m_test._M_dataplus._M_p = (pointer)local_c0;
    }
    local_60.m_test.field_2._M_allocated_capacity._1_7_ = local_b0._M_allocated_capacity._1_7_;
    local_60.m_test.field_2._M_local_buf[0] = local_b0._M_local_buf[0];
    local_60.m_test._M_string_length = local_b8;
    local_b8 = 0;
    local_b0._M_local_buf[0] = '\0';
    local_c0 = paVar6;
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>(ppcVar4,(char **)&DAT_0066d078,&local_60);
    bVar7 = ppcVar4 != (char **)&DAT_0066d078;
    paVar5 = local_c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60.m_test._M_dataplus._M_p != paVar1) {
      operator_delete(local_60.m_test._M_dataplus._M_p,
                      local_60.m_test.field_2._M_allocated_capacity + 1);
      paVar5 = local_c0;
    }
  }
  else {
    pcVar2 = (rhs->_M_dataplus)._M_p;
    local_120 = &local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_120,pcVar2,pcVar2 + rhs->_M_string_length);
    paVar6 = &local_80.m_test.field_2;
    if (local_120 == &local_110) {
      local_80.m_test.field_2._8_8_ = local_110._8_8_;
      local_80.m_test._M_dataplus._M_p = (pointer)paVar6;
    }
    else {
      local_80.m_test._M_dataplus._M_p = (pointer)local_120;
    }
    local_80.m_test.field_2._M_allocated_capacity._1_7_ = local_110._M_allocated_capacity._1_7_;
    local_80.m_test.field_2._M_local_buf[0] = local_110._M_local_buf[0];
    local_80.m_test._M_string_length = local_118;
    local_118 = 0;
    local_110._M_local_buf[0] = '\0';
    local_120 = &local_110;
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (CXX_STANDARDS,&PTR_anon_var_dwarf_21fdf3_0066d0a8,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80.m_test._M_dataplus._M_p != paVar6) {
      operator_delete(local_80.m_test._M_dataplus._M_p,
                      local_80.m_test.field_2._M_allocated_capacity + 1);
    }
    if (local_120 != &local_110) {
      operator_delete(local_120,
                      CONCAT71(local_110._M_allocated_capacity._1_7_,local_110._M_local_buf[0]) + 1)
      ;
    }
    paVar6 = &local_d0;
    pcVar2 = (lhs->_M_dataplus)._M_p;
    local_e0 = paVar6;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e0,pcVar2,pcVar2 + lhs->_M_string_length);
    paVar1 = &local_a0.m_test.field_2;
    if (local_e0 == paVar6) {
      local_a0.m_test.field_2._8_8_ = local_d0._8_8_;
      local_a0.m_test._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_a0.m_test._M_dataplus._M_p = (pointer)local_e0;
    }
    local_a0.m_test.field_2._M_allocated_capacity._1_7_ = local_d0._M_allocated_capacity._1_7_;
    local_a0.m_test.field_2._M_local_buf[0] = local_d0._M_local_buf[0];
    local_a0.m_test._M_string_length = local_d8;
    local_d8 = 0;
    local_d0._M_local_buf[0] = '\0';
    local_e0 = paVar6;
    ppcVar4 = std::find_if<char_const*const*,cmStrCmp>
                        (ppcVar4,&PTR_anon_var_dwarf_21fdf3_0066d0a8,&local_a0);
    bVar7 = ppcVar4 != &PTR_anon_var_dwarf_21fdf3_0066d0a8;
    paVar5 = local_e0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0.m_test._M_dataplus._M_p != paVar1) {
      operator_delete(local_a0.m_test._M_dataplus._M_p,
                      local_a0.m_test.field_2._M_allocated_capacity + 1);
      paVar5 = local_e0;
    }
  }
  if (paVar5 != paVar6) {
    operator_delete(paVar5,paVar6->_M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmMakefile::IsLaterStandard(std::string const& lang,
                                 std::string const& lhs,
                                 std::string const& rhs)
{
  if (lang == "C") {
    const char* const* rhsIt = std::find_if(
      cm::cbegin(C_STANDARDS), cm::cend(C_STANDARDS), cmStrCmp(rhs));

    return std::find_if(rhsIt, cm::cend(C_STANDARDS), cmStrCmp(lhs)) !=
      cm::cend(C_STANDARDS);
  }
  const char* const* rhsIt = std::find_if(
    cm::cbegin(CXX_STANDARDS), cm::cend(CXX_STANDARDS), cmStrCmp(rhs));

  return std::find_if(rhsIt, cm::cend(CXX_STANDARDS), cmStrCmp(lhs)) !=
    cm::cend(CXX_STANDARDS);
}